

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadStringFallback::anon_class_8_1_ba1d7991::
operator()(anon_class_8_1_ba1d7991 *this,char *p,int s)

{
  int s_local;
  char *p_local;
  anon_class_8_1_ba1d7991 *this_local;
  
  std::__cxx11::string::append((char *)this->str,(ulong)p);
  return;
}

Assistant:

const char* EpsCopyInputStream::AppendStringFallback(const char* ptr, int size,
                                                     std::string* str) {
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}